

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_thread_getpriority(uv_thread_t tid,int *priority)

{
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  int *piVar3;
  pthread_t __thread2;
  sched_param param;
  int policy;
  undefined8 local_28;
  
  local_28 = in_RAX;
  lVar2 = syscall(0xba);
  if (priority == (int *)0x0) {
    iVar1 = -0x16;
  }
  else {
    iVar1 = pthread_getschedparam(tid,(int *)((long)&local_28 + 4),(sched_param *)&local_28);
    if (iVar1 == 0) {
      if (local_28._4_4_ == 0) {
        __thread2 = pthread_self();
        iVar1 = pthread_equal(tid,__thread2);
        if (iVar1 != 0) {
          piVar3 = __errno_location();
          *piVar3 = 0;
          iVar1 = getpriority(PRIO_PROCESS,(id_t)lVar2);
          if ((iVar1 == -1) && (*piVar3 != 0)) {
            return -*piVar3;
          }
          *priority = iVar1;
          return 0;
        }
      }
      *priority = local_28._0_4_;
      iVar1 = 0;
    }
    else {
      piVar3 = __errno_location();
      iVar1 = -*piVar3;
    }
  }
  return iVar1;
}

Assistant:

int uv_thread_getpriority(uv_thread_t tid, int* priority) {
  int r;
  int policy;
  struct sched_param param;
#ifdef __linux__
  pid_t pid = gettid();
#endif

  if (priority == NULL)
    return UV_EINVAL;

  r = pthread_getschedparam(tid, &policy, &param);
  if (r != 0)
    return UV__ERR(errno);

#ifdef __linux__
  if (SCHED_OTHER == policy && pthread_equal(tid, pthread_self())) {
    errno = 0;
    r = getpriority(PRIO_PROCESS, pid);
    if (r == -1 && errno != 0)
      return UV__ERR(errno);
    *priority = r;
    return 0;
  }
#endif

  *priority = param.sched_priority;
  return 0;
}